

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

void __thiscall CDBBatch::EraseImpl(CDBBatch *this,Span<const_std::byte> key)

{
  long in_FS_OFFSET;
  Slice slKey;
  Slice local_28;
  long local_18;
  
  local_28.size_ = key.m_size;
  local_28.data_ = (char *)key.m_data;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  leveldb::WriteBatch::Delete
            (&((this->m_impl_batch)._M_t.
               super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
               .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl)->batch,
             &local_28);
  this->size_estimate = local_28.size_ + this->size_estimate + (ulong)(0x7f < local_28.size_) + 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDBBatch::EraseImpl(Span<const std::byte> key)
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());
    m_impl_batch->batch.Delete(slKey);
    // LevelDB serializes erases as:
    // - byte: header
    // - varint: key length
    // - byte[]: key
    // The formula below assumes the key is less than 16kB.
    size_estimate += 2 + (slKey.size() > 127) + slKey.size();
}